

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcZShapeProfileDef::~IfcZShapeProfileDef(IfcZShapeProfileDef *this)

{
  ~IfcZShapeProfileDef
            ((IfcZShapeProfileDef *)
             &this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68);
  return;
}

Assistant:

IfcZShapeProfileDef() : Object("IfcZShapeProfileDef") {}